

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall OpenMD::SC::~SC(SC *this)

{
  undefined8 *in_RDI;
  vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *unaff_retaddr;
  
  *in_RDI = &PTR__SC_00501398;
  *(undefined1 *)(in_RDI + 5) = 0;
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
           *)0x2f4a01);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2f4a0f);
  std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::clear
            ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)0x2f4a1d);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2f4a2b);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x2f4a3c);
  std::
  vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
  ::~vector((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
             *)unaff_retaddr);
  std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2f4a77);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  MetallicInteraction::~MetallicInteraction((MetallicInteraction *)0x2f4a8f);
  return;
}

Assistant:

SC::~SC() {
    initialized_ = false;

    MixingMap.clear();
    SCtypes.clear();
    SCdata.clear();
    SCtids.clear();
  }